

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O0

void __thiscall crypto_tests::CryptoTest::TestSHA256(CryptoTest *this,string *in,string *hexout)

{
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  CSHA256 *in_stack_00000018;
  CryptoTest *in_stack_00000020;
  CSHA256 *in_stack_ffffffffffffff18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  string_view in_stack_ffffffffffffff80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = local_70;
  CSHA256::CSHA256(in_stack_ffffffffffffff18);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff38);
  ParseHex<unsigned_char>(in_stack_ffffffffffffff80);
  TestVector<CSHA256,std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestSHA256(const std::string &in, const std::string &hexout) { TestVector(CSHA256(), in, ParseHex(hexout));}